

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash_motion.c
# Opt level: O2

void av1_generate_block_hash_value
               (IntraBCHashInfo *intrabc_hash_info,YV12_BUFFER_CONFIG *picture,int block_size,
               uint32_t **src_pic_block_hash,uint32_t **dst_pic_block_hash,
               int8_t **src_pic_block_same_info,int8_t **dst_pic_block_same_info)

{
  long lVar1;
  int iVar2;
  uint32_t *puVar3;
  int8_t *piVar4;
  uint32_t uVar5;
  int iVar6;
  ulong uVar7;
  int iVar8;
  uint uVar9;
  long lVar10;
  uint uVar11;
  long lVar12;
  int iVar13;
  long lVar14;
  int iVar15;
  int size_minus_1;
  uint uVar16;
  long lVar17;
  bool bVar18;
  uint32_t p [4];
  
  iVar2 = (picture->field_2).field_0.y_crop_width;
  iVar8 = (picture->field_3).field_0.y_crop_height - block_size;
  iVar15 = block_size >> 2;
  uVar16 = block_size - 1;
  lVar10 = (long)(block_size >> 1);
  lVar12 = (long)(iVar2 * (block_size >> 1));
  iVar13 = 0;
  for (iVar6 = 0; iVar6 <= iVar8; iVar6 = iVar6 + 1) {
    lVar17 = (long)iVar13;
    lVar1 = lVar10 + lVar12 + lVar17;
    for (lVar14 = 0; (int)lVar14 <= iVar2 - block_size; lVar14 = lVar14 + 1) {
      puVar3 = *src_pic_block_hash;
      p[0] = puVar3[lVar17 + lVar14];
      p[1] = puVar3[lVar17 + lVar10 + lVar14];
      p[2] = puVar3[lVar17 + lVar12 + lVar14];
      p[3] = puVar3[lVar17 + lVar10 + lVar12 + lVar14];
      uVar5 = av1_get_crc_value(&intrabc_hash_info->crc_calculator1,(uint8_t *)p,0x10);
      (*dst_pic_block_hash)[lVar17 + lVar14] = uVar5;
      puVar3 = src_pic_block_hash[1];
      p[0] = puVar3[lVar17 + lVar14];
      p[1] = puVar3[lVar17 + lVar10 + lVar14];
      p[2] = puVar3[lVar17 + lVar12 + lVar14];
      p[3] = puVar3[lVar17 + lVar10 + lVar12 + lVar14];
      uVar5 = av1_get_crc_value(&intrabc_hash_info->crc_calculator2,(uint8_t *)p,0x10);
      dst_pic_block_hash[1][lVar17 + lVar14] = uVar5;
      piVar4 = *src_pic_block_same_info;
      if (piVar4[lVar14 + lVar17] == '\0') {
        bVar18 = false;
      }
      else if ((((piVar4[lVar14 + iVar15 + lVar17] == '\0') ||
                (piVar4[lVar14 + lVar10 + lVar17] == '\0')) ||
               (piVar4[lVar14 + lVar12 + lVar17] == '\0')) ||
              (piVar4[lVar14 + iVar15 + lVar12 + lVar17] == '\0')) {
        bVar18 = false;
      }
      else {
        bVar18 = piVar4[lVar14 + lVar1] != '\0';
      }
      (*dst_pic_block_same_info)[lVar14 + lVar17] = bVar18;
      piVar4 = src_pic_block_same_info[1];
      if (((piVar4[lVar14 + lVar17] == '\0') || (piVar4[lVar14 + lVar10 + lVar17] == '\0')) ||
         ((piVar4[lVar14 + iVar2 * iVar15 + lVar17] == '\0' ||
          ((piVar4[lVar14 + iVar2 * iVar15 + lVar10 + lVar17] == '\0' ||
           (piVar4[lVar14 + lVar12 + lVar17] == '\0')))))) {
        bVar18 = false;
      }
      else {
        bVar18 = piVar4[lVar14 + lVar1] != '\0';
      }
      dst_pic_block_same_info[1][lVar14 + lVar17] = bVar18;
    }
    iVar13 = (int)lVar14 + iVar13 + uVar16;
  }
  if (3 < block_size) {
    uVar11 = 0;
    for (uVar9 = 0; (int)uVar9 <= iVar8; uVar9 = uVar9 + 1) {
      uVar7 = (ulong)uVar11;
      for (uVar11 = 0; (int)uVar11 <= iVar2 - block_size; uVar11 = uVar11 + 1) {
        if (((*dst_pic_block_same_info)[uVar7] == '\0') &&
           (dst_pic_block_same_info[1][uVar7] == '\0')) {
          bVar18 = true;
        }
        else {
          bVar18 = ((uVar11 | uVar9) & uVar16) == 0;
        }
        dst_pic_block_same_info[2][uVar7] = bVar18;
        uVar7 = uVar7 + 1;
      }
      uVar11 = (int)uVar7 + uVar16;
    }
  }
  return;
}

Assistant:

void av1_generate_block_hash_value(IntraBCHashInfo *intrabc_hash_info,
                                   const YV12_BUFFER_CONFIG *picture,
                                   int block_size,
                                   uint32_t *src_pic_block_hash[2],
                                   uint32_t *dst_pic_block_hash[2],
                                   int8_t *src_pic_block_same_info[3],
                                   int8_t *dst_pic_block_same_info[3]) {
  CRC_CALCULATOR *calc_1 = &intrabc_hash_info->crc_calculator1;
  CRC_CALCULATOR *calc_2 = &intrabc_hash_info->crc_calculator2;

  const int pic_width = picture->y_crop_width;
  const int x_end = picture->y_crop_width - block_size + 1;
  const int y_end = picture->y_crop_height - block_size + 1;

  const int src_size = block_size >> 1;
  const int quad_size = block_size >> 2;

  uint32_t p[4];
  const int length = sizeof(p);

  int pos = 0;
  for (int y_pos = 0; y_pos < y_end; y_pos++) {
    for (int x_pos = 0; x_pos < x_end; x_pos++) {
      p[0] = src_pic_block_hash[0][pos];
      p[1] = src_pic_block_hash[0][pos + src_size];
      p[2] = src_pic_block_hash[0][pos + src_size * pic_width];
      p[3] = src_pic_block_hash[0][pos + src_size * pic_width + src_size];
      dst_pic_block_hash[0][pos] =
          av1_get_crc_value(calc_1, (uint8_t *)p, length);

      p[0] = src_pic_block_hash[1][pos];
      p[1] = src_pic_block_hash[1][pos + src_size];
      p[2] = src_pic_block_hash[1][pos + src_size * pic_width];
      p[3] = src_pic_block_hash[1][pos + src_size * pic_width + src_size];
      dst_pic_block_hash[1][pos] =
          av1_get_crc_value(calc_2, (uint8_t *)p, length);

      dst_pic_block_same_info[0][pos] =
          src_pic_block_same_info[0][pos] &&
          src_pic_block_same_info[0][pos + quad_size] &&
          src_pic_block_same_info[0][pos + src_size] &&
          src_pic_block_same_info[0][pos + src_size * pic_width] &&
          src_pic_block_same_info[0][pos + src_size * pic_width + quad_size] &&
          src_pic_block_same_info[0][pos + src_size * pic_width + src_size];

      dst_pic_block_same_info[1][pos] =
          src_pic_block_same_info[1][pos] &&
          src_pic_block_same_info[1][pos + src_size] &&
          src_pic_block_same_info[1][pos + quad_size * pic_width] &&
          src_pic_block_same_info[1][pos + quad_size * pic_width + src_size] &&
          src_pic_block_same_info[1][pos + src_size * pic_width] &&
          src_pic_block_same_info[1][pos + src_size * pic_width + src_size];
      pos++;
    }
    pos += block_size - 1;
  }

  if (block_size >= 4) {
    const int size_minus_1 = block_size - 1;
    pos = 0;
    for (int y_pos = 0; y_pos < y_end; y_pos++) {
      for (int x_pos = 0; x_pos < x_end; x_pos++) {
        dst_pic_block_same_info[2][pos] =
            (!dst_pic_block_same_info[0][pos] &&
             !dst_pic_block_same_info[1][pos]) ||
            (((x_pos & size_minus_1) == 0) && ((y_pos & size_minus_1) == 0));
        pos++;
      }
      pos += block_size - 1;
    }
  }
}